

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadGrou_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  undefined8 uVar1;
  undefined8 uVar2;
  __shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *msh_00;
  Group *msh;
  shared_ptr<Assimp::COB::Group> local_60;
  shared_ptr<Assimp::COB::Node> local_50;
  undefined1 local_40 [8];
  chunk_guard cn;
  ChunkInfo *nfo_local;
  StreamReaderLE *reader_local;
  Scene *out_local;
  COBImporter *this_local;
  
  cn.cur = (long)nfo;
  if (nfo->version < 3) {
    chunk_guard::chunk_guard((chunk_guard *)local_40,nfo,reader);
    std::make_shared<Assimp::COB::Group>();
    std::shared_ptr<Assimp::COB::Node>::shared_ptr<Assimp::COB::Group,void>(&local_50,&local_60);
    std::
    deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
    ::push_back(&out->nodes,&local_50);
    std::shared_ptr<Assimp::COB::Node>::~shared_ptr(&local_50);
    std::shared_ptr<Assimp::COB::Group>::~shared_ptr(&local_60);
    this_00 = &std::
               deque<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
               ::back(&out->nodes)->
               super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>;
    msh_00 = std::__shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    uVar1 = *(undefined8 *)cn.cur;
    uVar2 = *(undefined8 *)(cn.cur + 8);
    (msh_00->super_ChunkInfo).id = (int)uVar1;
    (msh_00->super_ChunkInfo).parent_id = (int)((ulong)uVar1 >> 0x20);
    (msh_00->super_ChunkInfo).version = (int)uVar2;
    (msh_00->super_ChunkInfo).size = (int)((ulong)uVar2 >> 0x20);
    ReadBasicNodeInfo_Binary(this,msh_00,reader,(ChunkInfo *)cn.cur);
    chunk_guard::~chunk_guard((chunk_guard *)local_40);
  }
  else {
    UnsupportedChunk_Binary(this,reader,nfo,"Grou");
  }
  return;
}

Assistant:

void COBImporter::ReadGrou_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Grou");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::make_shared<Group>());
    Group& msh = (Group&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);
}